

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TasmanianSparseGrid.cpp
# Opt level: O2

void __thiscall
TasGrid::TasmanianSparseGrid::makeSequenceGrid
          (TasmanianSparseGrid *this,int dimensions,int outputs,int depth,TypeDepth type,
          TypeOneDRule rule,vector<int,_std::allocator<int>_> *anisotropic_weights,
          vector<int,_std::allocator<int>_> *level_limits)

{
  vector<int,_std::allocator<int>_> *this_00;
  pointer piVar1;
  pointer piVar2;
  BaseCanonicalGrid *pBVar3;
  _Alloc_hider _Var4;
  bool bVar5;
  invalid_argument *piVar6;
  byte bVar7;
  TypeOneDRule in_stack_ffffffffffffff5c;
  TypeOneDRule rule_local;
  TypeDepth type_local;
  int depth_local;
  int dimensions_local;
  int outputs_local;
  string message;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  rule_local = rule;
  type_local = type;
  depth_local = depth;
  dimensions_local = dimensions;
  outputs_local = outputs;
  if (dimensions < 1) {
    piVar6 = (invalid_argument *)__cxa_allocate_exception(0x10);
    ::std::invalid_argument::invalid_argument
              (piVar6,"ERROR: makeSequenceGrid() requires positive dimensions");
  }
  else if (outputs < 0) {
    piVar6 = (invalid_argument *)__cxa_allocate_exception(0x10);
    ::std::invalid_argument::invalid_argument
              (piVar6,"ERROR: makeSequenceGrid() requires non-negative outputs");
  }
  else if (depth < 0) {
    piVar6 = (invalid_argument *)__cxa_allocate_exception(0x10);
    ::std::invalid_argument::invalid_argument
              (piVar6,"ERROR: makeSequenceGrid() requires non-negative depth");
  }
  else {
    bVar5 = OneDimensionalMeta::isSequence(rule);
    if (!bVar5) {
      IO::getRuleString_abi_cxx11_(in_stack_ffffffffffffff5c);
      ::std::operator+(&local_68,"ERROR: makeSequenceGrid() is called with rule: ",&local_48);
      ::std::operator+(&message,&local_68,", which is not a sequence rule");
      ::std::__cxx11::string::~string((string *)&local_68);
      ::std::__cxx11::string::~string((string *)&local_48);
      piVar6 = (invalid_argument *)__cxa_allocate_exception(0x10);
      ::std::invalid_argument::invalid_argument(piVar6,(string *)&message);
      __cxa_throw(piVar6,&::std::invalid_argument::typeinfo,
                  ::std::invalid_argument::~invalid_argument);
    }
    bVar7 = 0;
    if (type - type_curved < 6) {
      bVar7 = (byte)*(undefined4 *)(&DAT_001ce074 + (ulong)(type - type_curved) * 4);
    }
    piVar1 = (anisotropic_weights->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
             super__Vector_impl_data._M_start;
    piVar2 = (anisotropic_weights->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
             super__Vector_impl_data._M_finish;
    if ((piVar1 == piVar2) ||
       ((long)piVar2 - (long)piVar1 >> 2 == (ulong)(uint)(dimensions << (bVar7 & 0x1f)))) {
      piVar1 = (level_limits->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
               super__Vector_impl_data._M_start;
      piVar2 = (level_limits->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
               super__Vector_impl_data._M_finish;
      if ((piVar1 == piVar2) || ((long)piVar2 - (long)piVar1 >> 2 == (ulong)(uint)dimensions)) {
        clear(this);
        this_00 = &this->llimits;
        ::std::vector<int,_std::allocator<int>_>::operator=(this_00,level_limits);
        local_68._M_dataplus._M_p =
             (pointer)(this->acceleration)._M_t.
                      super___uniq_ptr_impl<TasGrid::AccelerationContext,_std::default_delete<TasGrid::AccelerationContext>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_TasGrid::AccelerationContext_*,_std::default_delete<TasGrid::AccelerationContext>_>
                      .super__Head_base<0UL,_TasGrid::AccelerationContext_*,_false>._M_head_impl;
        if (outputs == 0) {
          Utils::
          make_unique<TasGrid::GridSequence,TasGrid::AccelerationContext*,int&,int&,TasGrid::TypeDepth&,TasGrid::TypeOneDRule&,std::vector<int,std::allocator<int>>const&,std::vector<int,std::allocator<int>>&>
                    ((Utils *)&message,(AccelerationContext **)&local_68,&dimensions_local,
                     &depth_local,&type_local,&rule_local,anisotropic_weights,this_00);
        }
        else {
          Utils::
          make_unique<TasGrid::GridSequence,TasGrid::AccelerationContext*,int&,int&,int&,TasGrid::TypeDepth&,TasGrid::TypeOneDRule&,std::vector<int,std::allocator<int>>const&,std::vector<int,std::allocator<int>>&>
                    ((Utils *)&message,(AccelerationContext **)&local_68,&dimensions_local,
                     &outputs_local,&depth_local,&type_local,&rule_local,anisotropic_weights,this_00
                    );
        }
        _Var4._M_p = message._M_dataplus._M_p;
        message._M_dataplus._M_p = (pointer)0x0;
        pBVar3 = (this->base)._M_t.
                 super___uniq_ptr_impl<TasGrid::BaseCanonicalGrid,_std::default_delete<TasGrid::BaseCanonicalGrid>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_TasGrid::BaseCanonicalGrid_*,_std::default_delete<TasGrid::BaseCanonicalGrid>_>
                 .super__Head_base<0UL,_TasGrid::BaseCanonicalGrid_*,_false>._M_head_impl;
        (this->base)._M_t.
        super___uniq_ptr_impl<TasGrid::BaseCanonicalGrid,_std::default_delete<TasGrid::BaseCanonicalGrid>_>
        ._M_t.
        super__Tuple_impl<0UL,_TasGrid::BaseCanonicalGrid_*,_std::default_delete<TasGrid::BaseCanonicalGrid>_>
        .super__Head_base<0UL,_TasGrid::BaseCanonicalGrid_*,_false>._M_head_impl =
             (BaseCanonicalGrid *)_Var4._M_p;
        if (pBVar3 != (BaseCanonicalGrid *)0x0) {
          (*pBVar3->_vptr_BaseCanonicalGrid[1])();
          if (message._M_dataplus._M_p != (pointer)0x0) {
            (**(code **)(*(long *)message._M_dataplus._M_p + 8))();
          }
        }
        return;
      }
      piVar6 = (invalid_argument *)__cxa_allocate_exception(0x10);
      ::std::invalid_argument::invalid_argument
                (piVar6,
                 "ERROR: makeSequenceGrid() requires level_limits with either 0 or dimensions entries"
                );
    }
    else {
      piVar6 = (invalid_argument *)__cxa_allocate_exception(0x10);
      ::std::invalid_argument::invalid_argument
                (piVar6,
                 "ERROR: makeSequenceGrid() requires anisotropic_weights with either 0 or dimensions entries"
                );
    }
  }
  __cxa_throw(piVar6,&::std::invalid_argument::typeinfo,::std::invalid_argument::~invalid_argument);
}

Assistant:

void TasmanianSparseGrid::makeSequenceGrid(int dimensions, int outputs, int depth, TypeDepth type, TypeOneDRule rule, const std::vector<int> &anisotropic_weights, const std::vector<int> &level_limits){
    if (dimensions < 1) throw std::invalid_argument("ERROR: makeSequenceGrid() requires positive dimensions");
    if (outputs < 0) throw std::invalid_argument("ERROR: makeSequenceGrid() requires non-negative outputs");
    if (depth < 0) throw std::invalid_argument("ERROR: makeSequenceGrid() requires non-negative depth");
    if (!OneDimensionalMeta::isSequence(rule)){
        std::string message = "ERROR: makeSequenceGrid() is called with rule: " + IO::getRuleString(rule) + ", which is not a sequence rule";
        throw std::invalid_argument(message);
    }
    size_t expected_aw_size = (OneDimensionalMeta::isTypeCurved(type)) ? 2*dimensions : dimensions;
    if ((!anisotropic_weights.empty()) && (anisotropic_weights.size() != expected_aw_size)) throw std::invalid_argument("ERROR: makeSequenceGrid() requires anisotropic_weights with either 0 or dimensions entries");
    if ((!level_limits.empty()) && (level_limits.size() != (size_t) dimensions)) throw std::invalid_argument("ERROR: makeSequenceGrid() requires level_limits with either 0 or dimensions entries");
    clear();
    llimits = level_limits;
    base = (outputs == 0) ? Utils::make_unique<GridSequence>(acceleration.get(), dimensions, depth, type, rule, anisotropic_weights, llimits) :
                            Utils::make_unique<GridSequence>(acceleration.get(), dimensions, outputs, depth, type, rule, anisotropic_weights, llimits);
}